

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

wchar_t cmp_desc_prio(void *left,void *right)

{
  wchar_t wVar1;
  wchar_t local_38;
  wchar_t local_34;
  wchar_t ind;
  wchar_t result;
  wchar_t right_ind;
  wchar_t left_ind;
  ui_entry *eright;
  ui_entry *eleft;
  void *right_local;
  void *left_local;
  
  eright = *left;
  _right_ind = *right;
  result = L'\xffffffff';
  ind = L'\xffffffff';
  eleft = (ui_entry *)right;
  right_local = left;
  if (category_for_cmp_desc_prio != (char *)0x0) {
    wVar1 = ui_entry_search_categories(eright,category_for_cmp_desc_prio,&local_38);
    if (wVar1 != L'\0') {
      result = local_38;
    }
    wVar1 = ui_entry_search_categories(_right_ind,category_for_cmp_desc_prio,&local_38);
    if (wVar1 != L'\0') {
      ind = local_38;
    }
  }
  if (result < L'\0') {
    if (ind < L'\0') {
      local_34 = strcmp(eright->name,_right_ind->name);
    }
    else {
      local_34 = L'\x01';
    }
  }
  else if (ind < L'\0') {
    local_34 = L'\xffffffff';
  }
  else if (_right_ind->categories[ind].priority < eright->categories[result].priority) {
    local_34 = L'\xffffffff';
  }
  else if (eright->categories[result].priority < _right_ind->categories[ind].priority) {
    local_34 = L'\x01';
  }
  else {
    local_34 = strcmp(eright->name,_right_ind->name);
  }
  return local_34;
}

Assistant:

static int cmp_desc_prio(const void *left, const void *right)
{
	const struct ui_entry *eleft =
		*((const struct ui_entry* const *) left);
	const struct ui_entry *eright =
		*((const struct ui_entry* const *) right);
	int left_ind = -1, right_ind = -1;
	int result;

	if (category_for_cmp_desc_prio) {
		int ind;

		if (ui_entry_search_categories(eleft,
			category_for_cmp_desc_prio, &ind)) {
			left_ind = ind;
		}
		if (ui_entry_search_categories(eright,
			category_for_cmp_desc_prio, &ind)) {
			right_ind = ind;
		}
	}
	if (left_ind >= 0) {
		if (right_ind >= 0) {
			if (eleft->categories[left_ind].priority >
				eright->categories[right_ind].priority) {
				result = -1;
			} else if (eleft->categories[left_ind].priority <
				   eright->categories[right_ind].priority) {
				result = 1;
			} else {
				result = strcmp(eleft->name, eright->name);
			}
		} else {
			/*
			 * right is not in the sort category so it should be
			 * pushed toward the end.
			 */
			result = -1;
		}
	} else if (right_ind >= 0) {
		/*
		 * left is not in the sort category so it should be pushed
		 * towards the end.
		 */
		result = 1;
	} else {
		result = strcmp(eleft->name, eright->name);
	}
	return result;
}